

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void fts3GetDeltaVarint3(char **pp,char *pEnd,int bDescIdx,sqlite3_int64 *pVal)

{
  int iVar1;
  undefined1 *puVar2;
  long in_FS_OFFSET;
  u64 iVal;
  undefined1 *local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (*pp < pEnd) {
    local_30 = &DAT_aaaaaaaaaaaaaaaa;
    iVar1 = sqlite3Fts3GetVarintU(*pp,(sqlite_uint64 *)&local_30);
    *pp = *pp + iVar1;
    puVar2 = (undefined1 *)-(long)local_30;
    if (bDescIdx == 0) {
      puVar2 = local_30;
    }
    *pVal = (sqlite3_int64)(puVar2 + *pVal);
  }
  else {
    *pp = (char *)0x0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void fts3GetDeltaVarint3(
  char **pp,                      /* IN/OUT: Point to read varint from */
  char *pEnd,                     /* End of buffer */
  int bDescIdx,                   /* True if docids are descending */
  sqlite3_int64 *pVal             /* IN/OUT: Integer value */
){
  if( *pp>=pEnd ){
    *pp = 0;
  }else{
    u64 iVal;
    *pp += sqlite3Fts3GetVarintU(*pp, &iVal);
    if( bDescIdx ){
      *pVal = (i64)((u64)*pVal - iVal);
    }else{
      *pVal = (i64)((u64)*pVal + iVal);
    }
  }
}